

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Input.cxx
# Opt level: O1

int __thiscall Fl_File_Input::handle_button(Fl_File_Input *this,int event)

{
  uint *puVar1;
  Fl_Window *this_00;
  char *pcVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  char *__s;
  char newvalue [2048];
  char local_828 [2048];
  
  __s = local_828;
  sVar3 = this->buttons_[0];
  if (sVar3 == 0) {
    uVar9 = 0;
    uVar8 = 0;
  }
  else {
    iVar7 = (this->super_Fl_Input).super_Fl_Input_.xscroll_;
    uVar9 = 0;
    iVar5 = 0;
    do {
      iVar5 = sVar3 + iVar5;
      iVar4 = iVar5 - iVar7;
      if ((iVar4 != 0 && iVar7 <= iVar5) &&
         (Fl::e_x < iVar4 + (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_)) break;
      sVar3 = this->buttons_[uVar9 + 1];
      uVar9 = uVar9 + 1;
    } while (sVar3 != 0);
    uVar8 = uVar9 & 0xffffffff;
  }
  sVar3 = -1;
  if (event != 2) {
    sVar3 = (short)uVar8;
  }
  this->pressed_ = sVar3;
  this_00 = Fl_Widget::window((Fl_Widget *)this);
  Fl_Window::make_current(this_00);
  draw_buttons(this);
  if ((event == 2) && (this->buttons_[uVar9] != 0)) {
    fl_strlcpy(local_828,(this->super_Fl_Input).super_Fl_Input_.value_,0x800);
    pcVar2 = local_828;
    if ((int)uVar8 < 0) {
      bVar6 = 1;
    }
    else {
      do {
        __s = pcVar2;
        iVar7 = (int)uVar8;
        bVar6 = (byte)(uVar8 >> 0x18);
        pcVar2 = strchr(__s,0x2f);
        if (pcVar2 == (char *)0x0) goto LAB_001ae2d0;
        __s = pcVar2 + 1;
        uVar8 = (ulong)(iVar7 - 1);
        pcVar2 = __s;
      } while (0 < iVar7);
      bVar6 = 0xff;
LAB_001ae2d0:
      bVar6 = bVar6 >> 7;
    }
    if (bVar6 != 0) {
      *__s = '\0';
      Fl_Widget::damage((Fl_Widget *)this,'\x10');
      Fl_Input_::value((Fl_Input_ *)this,local_828,(int)__s - (int)local_828);
      puVar1 = &(this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.flags_;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
      if (((this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.when_ & 5) != 0) {
        Fl_Widget::do_callback
                  ((Fl_Widget *)this,(Fl_Widget *)this,
                   (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.user_data_);
      }
    }
  }
  return 1;
}

Assistant:

int						// O - TRUE if we handled event
Fl_File_Input::handle_button(int event)		// I - Event
{
  int		i,				// Looping var
		X;				// Current X position
  char		*start,				// Start of path component
		*end;				// End of path component
  char		newvalue[FL_PATH_MAX];		// New value


  // Figure out which button is being pressed...
  for (X = 0, i = 0; buttons_[i]; i ++)
  {
    X += buttons_[i];

    if (X > xscroll() && Fl::event_x() < (x() + X - xscroll())) break;
  }

//  printf("handle_button(event = %d), button = %d\n", event, i);

  // Redraw the directory bar...
  if (event == FL_RELEASE) pressed_ = -1;
  else pressed_ = (short)i;

  window()->make_current();
  draw_buttons();

  // Return immediately if the user is clicking on the last button or
  // has not released the mouse button...
  if (!buttons_[i] || event != FL_RELEASE) return 1;

  // Figure out where to truncate the path...
  strlcpy(newvalue, value(), sizeof(newvalue));

  for (start = newvalue, end = start; start && i >= 0; start = end, i --) {
//    printf("    start = \"%s\"\n", start);
    if ((end = strchr(start, '/')) == NULL)
#if defined(WIN32) || defined(__EMX__)
      if ((end = strchr(start, '\\')) == NULL)
#endif // WIN32 || __EMX__
      break;

    end ++;
  }

  if (i < 0) {
    // Found the end; truncate the value and update the buttons...
    *start = '\0';
    value(newvalue, (int) (start - newvalue) );

    // Then do the callbacks, if necessary...
    set_changed();
    if (when() & (FL_WHEN_CHANGED|FL_WHEN_RELEASE) ) do_callback();
  }

  return 1;
}